

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
Tree::BuildUnitImpl(Tree *this,cmXMLWriter *xml,string *virtualFolderPath,string *fsPath)

{
  Tree *this_00;
  pointer __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (__rhs = (this->files).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __rhs != (this->files).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
    std::__cxx11::string::string((string *)&local_90,"Unit",(allocator *)&local_b0);
    cmXMLWriter::StartElement(xml,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::operator+(&local_70,fsPath,&this->path);
    std::operator+(&local_b0,&local_70,"/");
    std::operator+(&local_90,&local_b0,__rhs);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_90,"Option",(allocator *)&local_b0);
    cmXMLWriter::StartElement(xml,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::operator+(&local_70,"CMake Files\\",virtualFolderPath);
    std::operator+(&local_b0,&local_70,&this->path);
    std::operator+(&local_90,&local_b0,"\\");
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"virtualFolder",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
  }
  for (this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                 super__Vector_impl_data._M_start;
      this_00 !=
      (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
      super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    std::operator+(&local_b0,virtualFolderPath,&this->path);
    std::operator+(&local_90,&local_b0,"\\");
    std::operator+(&local_50,fsPath,&this->path);
    std::operator+(&local_70,&local_50,"/");
    BuildUnitImpl(this_00,xml,&local_90,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

void Tree::BuildUnitImpl(cmXMLWriter& xml,
                         const std::string& virtualFolderPath,
                         const std::string& fsPath) const
{
  for (std::vector<std::string>::const_iterator it = files.begin();
       it != files.end(); ++it) {
    xml.StartElement("Unit");
    xml.Attribute("filename", fsPath + path + "/" + *it);

    xml.StartElement("Option");
    xml.Attribute("virtualFolder",
                  "CMake Files\\" + virtualFolderPath + path + "\\");
    xml.EndElement();

    xml.EndElement();
  }
  for (std::vector<Tree>::const_iterator it = folders.begin();
       it != folders.end(); ++it) {
    it->BuildUnitImpl(xml, virtualFolderPath + path + "\\",
                      fsPath + path + "/");
  }
}